

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_variable_elimination.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DeadVariableElimination::DeleteVariable
          (DeadVariableElimination *this,uint32_t result_id)

{
  Op OVar1;
  uint32_t uVar2;
  DefUseManager *pDVar3;
  mapped_type *pmVar4;
  IRContext *this_00;
  size_t *count;
  Instruction *pIStack_28;
  uint32_t initializer_id;
  Instruction *initializer;
  Instruction *inst;
  DeadVariableElimination *pDStack_10;
  uint32_t result_id_local;
  DeadVariableElimination *this_local;
  
  inst._4_4_ = result_id;
  pDStack_10 = this;
  pDVar3 = Pass::get_def_use_mgr((Pass *)this);
  initializer = analysis::DefUseManager::GetDef(pDVar3,inst._4_4_);
  OVar1 = opt::Instruction::opcode(initializer);
  if (OVar1 == OpVariable) {
    uVar2 = opt::Instruction::NumOperands(initializer);
    if (uVar2 == 4) {
      pDVar3 = Pass::get_def_use_mgr((Pass *)this);
      uVar2 = opt::Instruction::GetSingleWordOperand(initializer,3);
      pIStack_28 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
      OVar1 = opt::Instruction::opcode(pIStack_28);
      if (OVar1 == OpVariable) {
        count._4_4_ = opt::Instruction::result_id(pIStack_28);
        pmVar4 = std::
                 unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                 ::operator[](&this->reference_count_,(key_type *)((long)&count + 4));
        if (*pmVar4 != 0x7fffffff) {
          *pmVar4 = *pmVar4 - 1;
        }
        if (*pmVar4 == 0) {
          DeleteVariable(this,count._4_4_);
        }
      }
    }
    this_00 = Pass::context((Pass *)this);
    IRContext::KillDef(this_00,inst._4_4_);
    return;
  }
  __assert_fail("inst->opcode() == spv::Op::OpVariable && \"Should not be trying to delete anything other than an OpVariable.\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/dead_variable_elimination.cpp"
                ,0x56,"void spvtools::opt::DeadVariableElimination::DeleteVariable(uint32_t)");
}

Assistant:

void DeadVariableElimination::DeleteVariable(uint32_t result_id) {
  Instruction* inst = get_def_use_mgr()->GetDef(result_id);
  assert(inst->opcode() == spv::Op::OpVariable &&
         "Should not be trying to delete anything other than an OpVariable.");

  // Look for an initializer that references another variable.  We need to know
  // if that variable can be deleted after the reference is removed.
  if (inst->NumOperands() == 4) {
    Instruction* initializer =
        get_def_use_mgr()->GetDef(inst->GetSingleWordOperand(3));

    // TODO: Handle OpSpecConstantOP which might be defined in terms of other
    // variables.  Will probably require a unified dead code pass that does all
    // instruction types.  (Issue 906)
    if (initializer->opcode() == spv::Op::OpVariable) {
      uint32_t initializer_id = initializer->result_id();
      size_t& count = reference_count_[initializer_id];
      if (count != kMustKeep) {
        --count;
      }

      if (count == 0) {
        DeleteVariable(initializer_id);
      }
    }
  }
  context()->KillDef(result_id);
}